

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

bool __thiscall
implementations::scheme::SchemeFrame::resolveExpression(SchemeFrame *this,cell *value)

{
  value_type *__x;
  pointer pcVar1;
  pointer pcVar2;
  env_p *peVar3;
  cell_type cVar4;
  int iVar5;
  map *this_00;
  bool bVar6;
  cells *this_01;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *pvVar7;
  pointer pcVar8;
  string first;
  allocator_type local_c9;
  long *local_c8 [2];
  long local_b8 [2];
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_a8;
  pointer local_88;
  _Alloc_hider _Stack_80;
  pointer local_78;
  
  cVar4 = value->type;
  if (cVar4 != List) {
    if ((cVar4 != Number) && (cVar4 == Symbol)) {
      this_00 = environment::find((this->
                                  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                                  ).env.
                                  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,&value->val);
      value = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
              ::operator[](this_00,&value->val);
      cVar4 = value->type;
    }
    (this->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.type = cVar4;
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                ).result.val);
    pvVar7 = &value->list;
LAB_0012319b:
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    operator=(&(this->
               super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
               ).result.list,pvVar7);
    (this->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.proc = value->proc;
    (this->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.env.
    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (value->env).
         super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                ).result.env.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(value->env).
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return true;
  }
  pvVar7 = &value->list;
  pcVar1 = (value->list).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar1 == (value->list).
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.type = List;
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                ).result.val);
    goto LAB_0012319b;
  }
  pcVar2 = (pcVar1->val)._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar2,pcVar2 + (pcVar1->val)._M_string_length);
  pcVar1 = (pvVar7->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->arguments).
             super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
  _Stack_80._M_p =
       (pointer)(this->arguments).
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = (this->arguments).
             super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->arguments).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *)
          &local_88);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_a8);
  pcVar8 = (pvVar7->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_start;
  (this->exp).type = pcVar8->type;
  std::__cxx11::string::_M_assign((string *)&(this->exp).val);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(&(this->exp).list,&pcVar8->list);
  (this->exp).proc = pcVar8->proc;
  (this->exp).env.
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pcVar8->env).
       super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->exp).env.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(pcVar8->env).
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if ((this->exp).type == Symbol) {
    iVar5 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar5 == 0) {
      pcVar1 = (pvVar7->
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (this->
      super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
      ).result.type = pcVar1[1].type;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this->
                  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                  ).result.val);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      operator=(&(this->
                 super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                 ).result.list,&pcVar1[1].list);
      (this->
      super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
      ).result.proc = pcVar1[1].proc;
      (this->
      super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
      ).result.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pcVar1[1].env.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      peVar3 = &pcVar1[1].env;
LAB_001234b6:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->
                  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                  ).result.env.
                  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)peVar3 + 8));
      bVar6 = true;
      goto LAB_00123535;
    }
    __x = pcVar1 + 1;
    this_01 = &this->arguments;
    iVar5 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar5 == 0) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(this_01,__x);
      this_01 = &this->resolved_arguments;
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(this_01,pcVar1 + 2);
      pcVar8 = (value_type *)&nil;
      if (pcVar1 + 3 !=
          (value->list).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar8 = pcVar1 + 3;
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_c8);
      if (iVar5 == 0) {
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,__x);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_c8);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)local_c8);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)local_c8);
            if (iVar5 != 0) goto LAB_001232e8;
            std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
            ::
            vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
                      ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                        *)&local_88,
                       (value->list).
                       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       (value->list).
                       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_a8);
            pvVar7 = (vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                      *)&local_88;
            std::
            vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
            _M_move_assign(&this->resolved_arguments,pvVar7);
            goto LAB_00123367;
          }
          cell::cell((cell *)&local_88,value);
          cell::operator=(&(this->
                           super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                           ).result,(cell *)&local_88);
          cell::~cell((cell *)&local_88);
          (this->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          ).result.type = Lambda;
          (this->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          ).result.env.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (this->
                   super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                   ).env.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          peVar3 = &(this->
                    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                    ).env;
          goto LAB_001234b6;
        }
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,__x);
      }
      pcVar8 = pcVar1 + 2;
    }
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    push_back(this_01,pcVar8);
  }
  else {
LAB_001232e8:
    std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
    vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
              ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                *)&local_a8,
               (value->list).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (value->list).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_c9);
    local_88 = (this->arguments).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
    _Stack_80._M_p =
         (pointer)(this->arguments).
                  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_78 = (this->arguments).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar7 = &local_a8;
    (this->arguments).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_a8.
         super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->arguments).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_a8.
         super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->arguments).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_a8.
         super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a8.
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector((vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> *
            )&local_88);
LAB_00123367:
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector(pvVar7);
  }
  bVar6 = false;
LAB_00123535:
  if (local_c8[0] == local_b8) {
    return bVar6;
  }
  operator_delete(local_c8[0],local_b8[0] + 1);
  return bVar6;
}

Assistant:

bool resolveExpression(cell &value) {
		switch (value.type) {
		case Symbol:
			result = lookup(value.val);
			return true;
		case Number:
			result = value;
			return true;
		case List:
		{
			if (value.list.empty()) {
				result = value;
				return true;
			}
			auto first = value.list[0].val;
			// iterator skips first item
			cells::iterator it = value.list.begin() + 1;
			arguments = cells();
			exp = value.list[0];
			if (exp.type == Symbol) {
				if (first == "quote") {         // (quote exp)
					result = value.list[1];
					return true;
				} else if (first == "if") {     // (if test conseq [alt])
					// becomes (if conseq alt test)
					// test
					arguments.push_back(*it); ++it;
					// conseq
					resolved_arguments.push_back(*it); ++it;
					// [alt]
					if (it != value.list.cend())
						resolved_arguments.push_back(*it);
					else
						resolved_arguments.push_back(nil);
					return false;
				} else if (first == "set!") {   // (set! var exp)
					// var
					resolved_arguments.push_back(*it); ++it;
					arguments.push_back(*it); ++it;
					return false;
				} else if (first == "define") { // (define var exp)
					// var
					resolved_arguments.push_back(*it); ++it;
					// exp
					arguments.push_back(*it); ++it;
					return false;
				} else if (first == "lambda") { // (lambda (var*) exp)
					result = cell(value);
					result.type = Lambda;
					result.env = env;
					return true;
				} else if (first == "begin") {  // (begin exp*)
					resolved_arguments = cells(value.list.cbegin() + 1, value.list.cend());
					return false;
				}
			}
			// (proc exp*)
			arguments = cells(value.list.cbegin(), value.list.cend());
			return false;
		}
		default:
			// Other sort of value
			result = value;
			return true;
		}
	}